

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void mock_assert(int result,char *expression,char *file,int line)

{
  undefined4 in_ECX;
  char *in_RSI;
  int in_EDI;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_EDI == 0) {
    if (global_expecting_assert != 0) {
      global_last_failed_assert = in_RSI;
      longjmp((__jmp_buf_tag *)global_expect_assert_env,0);
    }
    cm_print_error("ASSERT: %s\n",in_RSI);
    _fail((char *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

void mock_assert(const int result, const char* const expression,
                 const char* const file, const int line) {
    if (!result) {
        if (global_expecting_assert) {
            global_last_failed_assert = expression;
            longjmp(global_expect_assert_env, result);
        } else {
            cm_print_error("ASSERT: %s\n", expression);
            _fail(file, line);
        }
    }
}